

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O3

void __thiscall
Iir::ChebyshevI::BandPassBase::setup
          (BandPassBase *this,int order,double centerFrequency,double widthFrequency,double rippleDb
          )

{
  AnalogLowPass *this_00;
  LayoutBase *digital;
  BandPassTransform local_58;
  
  this_00 = &(this->super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).m_analogProto;
  AnalogLowPass::design(this_00,order,rippleDb);
  digital = &(this->super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.
             m_digitalProto;
  BandPassTransform::BandPassTransform
            (&local_58,centerFrequency,widthFrequency,digital,&this_00->super_LayoutBase);
  Cascade::setLayout((Cascade *)this,digital);
  return;
}

Assistant:

void BandPassBase::setup (int order,
                          double centerFrequency,
                          double widthFrequency,
                          double rippleDb)
{
  m_analogProto.design (order, rippleDb);

  BandPassTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}